

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O2

QRgbaFloat32 *
fetchIndexedToRGBA32F<(QPixelLayout::BPP)2>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *clut,
          QDitherInfo *param_6)

{
  float *pfVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  QRgbaFloat<float> QVar5;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)count;
  if (count < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 * 0x10 != uVar2; uVar2 = uVar2 + 0x10) {
    QVar5 = QRgbaFloat<float>::fromArgb32((clut->d).ptr[(src[index >> 3] >> (index & 7U) & 1) != 0])
    ;
    fVar4 = QVar5.a;
    pfVar1 = (float *)((long)&buffer->r + uVar2);
    *pfVar1 = QVar5.r * fVar4;
    pfVar1[1] = QVar5.g * fVar4;
    pfVar1[2] = fVar4 * QVar5.b;
    pfVar1[3] = fVar4;
    index = index + 1;
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchIndexedToRGBA32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                         const QList<QRgb> *clut, QDitherInfo *)
{
    for (int i = 0; i < count; ++i) {
        const uint s = fetchPixel<BPP>(src, index + i);
        buffer[i] = QRgbaFloat32::fromArgb32(clut->at(s)).premultiplied();
    }
    return buffer;
}